

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Between.hpp
# Opt level: O1

string * __thiscall
ut11::Operands::IsBetween<int,_int>::GetErrorMessage<int>
          (string *__return_storage_ptr__,IsBetween<int,_int> *this,int *actual)

{
  int *piVar1;
  ostream *poVar2;
  stringstream errorMessage;
  char *local_398;
  long local_390;
  char local_388 [16];
  char *local_378;
  long local_370;
  char local_368 [16];
  char *local_358;
  long local_350;
  char local_348 [16];
  stringstream local_338 [16];
  ostream local_328 [112];
  ios_base local_2b8 [264];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Expected between ",0x11);
  piVar1 = this->low;
  std::__cxx11::stringstream::stringstream(local_338);
  std::ostream::operator<<(local_328,*piVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_338);
  std::ios_base::~ios_base(local_2b8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_358,local_350);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," and ",5);
  piVar1 = this->high;
  std::__cxx11::stringstream::stringstream(local_338);
  std::ostream::operator<<(local_328,*piVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_338);
  std::ios_base::~ios_base(local_2b8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_378,local_370);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," but was ",9);
  std::__cxx11::stringstream::stringstream(local_338);
  std::ostream::operator<<(local_328,*actual);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_338);
  std::ios_base::~ios_base(local_2b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_398,local_390);
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  if (local_378 != local_368) {
    operator_delete(local_378);
  }
  if (local_358 != local_348) {
    operator_delete(local_358);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const Q& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected between " << ut11::utility::ToString(low) << " and " << ut11::utility::ToString(high) << " but was " << ut11::utility::ToString(actual);
				return errorMessage.str();
			}